

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RasterizerTests::CoordinatesTranslationAppliedForClippingWindow(RasterizerTests *this)

{
  rect<float> rVar1;
  allocator local_311;
  string local_310 [32];
  LocationInfo local_2f0;
  allocator local_2c1;
  string local_2c0 [32];
  LocationInfo local_2a0;
  uchar auStack_278 [8];
  uint8_t reference2 [63];
  uint8_t reference1 [35];
  simple_alpha<unsigned_char,_8UL> local_209;
  blender<unsigned_char,_unsigned_char> local_208;
  zero local_1e5;
  vector_i local_1e4;
  simple_alpha<unsigned_char,_8UL> local_1d9;
  blender<unsigned_char,_unsigned_char> local_1d8;
  zero local_1b9;
  vector_i local_1b8;
  rect<float> local_1b0;
  rect<float> local_1a0;
  undefined1 local_190 [8];
  renderer r;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
  r2;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
  r1;
  undefined1 local_50 [8];
  bitmap<unsigned_char,_0UL,_0UL> b2;
  bitmap<unsigned_char,_0UL,_0UL> b1;
  RasterizerTests *this_local;
  
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b2._width,5,7);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_50,7,9);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
                *)&r2._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
                *)&r._scanline_cache._size);
  renderer::renderer((renderer *)local_190);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,3.0);
  local_1a0._8_8_ = rVar1._8_8_;
  local_1a0._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
                  *)&r2._start_y,&local_1a0);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,2.5);
  local_1b0._8_8_ = rVar1._8_8_;
  local_1b0._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
                  *)&r._scanline_cache._size,&local_1b0);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
             *)&r2._start_y,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r2._start_y,false);
  local_1b8 = zero::operator_cast_to_agge_vector(&local_1b9);
  local_1d8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender(&local_1d8);
  renderer::operator()
            ((renderer *)local_190,(bitmap<unsigned_char,_0UL,_0UL> *)&b2._width,local_1b8,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
              *)&r2._start_y,&local_1d8,&local_1d9);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender(&local_1d8);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
             *)&r._scanline_cache._size,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r._scanline_cache._size,false);
  local_1e4 = zero::operator_cast_to_agge_vector(&local_1e5);
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender(&local_208);
  renderer::operator()
            ((renderer *)local_190,(bitmap<unsigned_char,_0UL,_0UL> *)local_50,local_1e4,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
              *)&r._scanline_cache._size,&local_208,&local_209);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender(&local_208);
  stack0xfffffffffffffdc8 = 0xb8b8000000000000;
  reference2[0x28] = 0xa8;
  reference2[0x29] = '\0';
  reference2[0x2a] = '@';
  reference2[0x2b] = 0x80;
  reference2[0x2c] = 0x80;
  reference2[0x2d] = 0x80;
  reference2[0x2e] = 0x80;
  reference2[0x2f] = 'T';
  reference2[0x30] = '\0';
  reference2[0x31] = '\0';
  reference2[0x32] = '\0';
  reference2[0x33] = '\0';
  reference2[0x34] = '\0';
  reference2[0x35] = '\0';
  reference2[0x36] = '\0';
  reference2[0x18] = 0xff;
  reference2[0x19] = 0xff;
  reference2[0x1a] = 0xa8;
  reference2[0x1b] = '\0';
  reference2[0x1c] = 0x80;
  reference2[0x1d] = 0xff;
  reference2[0x1e] = 0xff;
  reference2[0x1f] = 0xff;
  reference2[0x20] = 0xff;
  reference2[0x21] = 0xa8;
  reference2[0x22] = '\0';
  reference2[0x23] = 0x80;
  reference2[0x24] = 0xff;
  reference2[0x25] = 0xff;
  reference2[0x26] = 0xff;
  reference2[0x27] = 0xff;
  reference2[8] = 0xff;
  reference2[9] = 0xff;
  reference2[10] = 0xff;
  reference2[0xb] = 0xff;
  reference2[0xc] = 0xa8;
  reference2[0xd] = '\0';
  reference2[0xe] = 0x80;
  reference2[0xf] = 0xff;
  reference2[0x10] = 0xff;
  reference2[0x11] = 0xff;
  reference2[0x12] = 0xff;
  reference2[0x13] = 0xa8;
  reference2[0x14] = '\0';
  reference2[0x15] = 0x80;
  reference2[0x16] = 0xff;
  reference2[0x17] = 0xff;
  auStack_278[0] = '\0';
  auStack_278[1] = '\0';
  auStack_278[2] = '\0';
  auStack_278[3] = '\0';
  auStack_278[4] = '\0';
  auStack_278[5] = '\0';
  auStack_278[6] = '\0';
  auStack_278[7] = '\0';
  reference2[0] = '\n';
  reference2[1] = '\x14';
  reference2[2] = '\x14';
  reference2[3] = '\x14';
  reference2[4] = '\x14';
  reference2[5] = '\r';
  reference2[6] = '\0';
  reference2[7] = 0x80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_2c1);
  ut::LocationInfo::LocationInfo(&local_2a0,(string *)local_2c0,0x147);
  ut::are_equal<unsigned_char,35ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [35])(reference2 + 0x38),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&b2._width,&local_2a0);
  ut::LocationInfo::~LocationInfo(&local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_311);
  ut::LocationInfo::LocationInfo(&local_2f0,(string *)local_310,0x148);
  ut::are_equal<unsigned_char,63ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [63])auStack_278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&local_2f0);
  ut::LocationInfo::~LocationInfo(&local_2f0);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  renderer::~renderer((renderer *)local_190);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<3,_1>_>
                 *)&r._scanline_cache._size);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<2,_1>_>
                 *)&r2._start_y);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_50);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b2._width);
  return;
}

Assistant:

test( CoordinatesTranslationAppliedForClippingWindow )
			{
				// INIT
				mocks::bitmap<uint8_t> b1(5, 7), b2(7, 9);
				rasterizer< emitting_clipper<int>, scaling_i<2, 1> > r1;
				rasterizer< emitting_clipper<int>, scaling_i<3, 1> > r2;
				renderer r;

				// ACT
				r1.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 3.0f));
				r2.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.5f));

				// ACT / ASSERT
				r1.line_to(0.0f, 0.0f);
				r1.sort();
				r(b1, zero(), 0, r1, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r2.line_to(0.0f, 0.0f);
				r2.sort();
				r(b2, zero(), 0, r2, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				uint8_t reference1[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xB8, 0xB8, 0xB8, 0x50,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0x00, 0x00, 0x00, 0x00,
				};

				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x0a, 0x14, 0x14, 0x14, 0x14, 0x0d,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x40, 0x80, 0x80, 0x80, 0x80, 0x54,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, b1.data);
				assert_equal(reference2, b2.data);
			}